

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

uint8_t bcm2835_gpio_lev(uint8_t pin)

{
  uint32_t uVar1;
  uint32_t value;
  uint8_t shift;
  uint32_t *paddr;
  uint8_t pin_local;
  
  uVar1 = bcm2835_peri_read(bcm2835_gpio + (long)(int)(pin / 0x20) + 0xd);
  return (uVar1 & 1 << pin % 0x20) != 0;
}

Assistant:

uint8_t bcm2835_gpio_lev(uint8_t pin)
{
    volatile uint32_t* paddr = bcm2835_gpio + BCM2835_GPLEV0/4 + pin/32;
    uint8_t shift = pin % 32;
    uint32_t value = bcm2835_peri_read(paddr);
    return (value & (1 << shift)) ? HIGH : LOW;
}